

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O3

void __thiscall QGestureManager::~QGestureManager(QGestureManager *this)

{
  long *plVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar3;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *extraout_RDX;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *extraout_RDX_01;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar4;
  ulong uVar5;
  long lVar6;
  const_iterator end;
  const_iterator begin;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar7;
  long lVar8;
  long in_FS_OFFSET;
  const_iterator begin_00;
  const_iterator end_00;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_48;
  ulong local_40;
  size_t local_38;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *extraout_RDX_00;
  
  local_38 = *(size_t *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007e6790;
  lVar6 = *(long *)(this + 0x10);
  if (lVar6 == 0) {
    begin._M_node = (_Base_ptr)0x0;
  }
  else {
    begin._M_node = *(_Base_ptr *)(lVar6 + 0x20);
  }
  end._M_node = (_Base_ptr)(lVar6 + 0x10);
  if (lVar6 == 0) {
    end._M_node = (_Base_ptr)0x0;
  }
  qDeleteAll<QMultiMap<Qt::GestureType,QGestureRecognizer*>::const_iterator>
            ((const_iterator)begin._M_node,(const_iterator)end._M_node);
  lVar6 = *(long *)(this + 0x50);
  pDVar4 = extraout_RDX;
  if (lVar6 == 0) {
    lVar6 = 0;
    pDVar7 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
LAB_002d0e14:
    if (lVar6 == 0 && pDVar7 == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0)
    goto LAB_002d0f2c;
  }
  else {
    if (**(char **)(lVar6 + 0x20) == -1) {
      pDVar4 = *(Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> **)(lVar6 + 0x10);
      pDVar3 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x1;
      do {
        pDVar7 = pDVar3;
        if (pDVar4 == pDVar7) {
          lVar6 = 0;
          pDVar7 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
          break;
        }
        pDVar3 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)
                 ((long)&(pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i + 1);
      } while ((*(char **)(lVar6 + 0x20))
               [(ulong)((uint)pDVar7 & 0x7f) + ((ulong)pDVar7 >> 7) * 0x90] == -1);
      goto LAB_002d0e14;
    }
    pDVar7 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
  }
  do {
    lVar8 = ((ulong)pDVar7 >> 7) * 0x90;
    uVar5 = (ulong)((uint)pDVar7 & 0x7f);
    local_48 = *(long *)(*(long *)(*(long *)(lVar6 + 0x20) + 0x80 + lVar8) + 8 +
                        (ulong)*(byte *)(uVar5 + *(long *)(lVar6 + 0x20) + lVar8) * 0x10);
    if (local_48 == 0) {
LAB_002d0e9e:
      local_48 = 0;
LAB_002d0ea0:
      local_40 = 0;
    }
    else {
      pDVar4 = *(Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> **)(local_48 + 0x20);
      if ((char)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)
      goto LAB_002d0ea0;
      uVar2 = 1;
      do {
        local_40 = uVar2;
        if (*(ulong *)(local_48 + 0x10) == local_40) goto LAB_002d0e9e;
        uVar2 = local_40 + 1;
      } while (*(char *)((long)pDVar4 + (ulong)((uint)local_40 & 0x7f) + (local_40 >> 7) * 0x90) ==
               -1);
    }
    local_58 = 0;
    uStack_50 = 0;
    begin_00.i.i.bucket = (size_t)&local_58;
    begin_00.i.i.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)&local_48;
    end_00.i.i.bucket = local_40;
    end_00.i.i.d = pDVar4;
    qDeleteAll<QSet<QGesture*>::const_iterator>(begin_00,end_00);
    plVar1 = *(long **)(*(long *)(*(long *)(lVar6 + 0x20) + 0x80 + lVar8) +
                       (ulong)*(byte *)(uVar5 + *(long *)(lVar6 + 0x20) + lVar8) * 0x10);
    pDVar4 = extraout_RDX_00;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      pDVar4 = extraout_RDX_01;
    }
    do {
      if ((Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)(*(long *)(lVar6 + 0x10) - 1U)
          == pDVar7) {
        lVar6 = 0;
        pDVar7 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
        break;
      }
      pDVar7 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)
               ((long)&(pDVar7->ref).atomic._q_value.super___atomic_base<int>._M_i + 1);
      pDVar4 = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)
               (ulong)((uint)pDVar7 & 0x7f);
    } while (*(char *)((long)pDVar4 + ((ulong)pDVar7 >> 7) * 0x90 + *(long *)(lVar6 + 0x20)) == -1);
  } while ((lVar6 != 0) || (pDVar7 != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0)
          );
LAB_002d0f2c:
  QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)(this + 0x60));
  QHash<QGesture_*,_QGestureRecognizer_*>::~QHash
            ((QHash<QGesture_*,_QGestureRecognizer_*> *)(this + 0x58));
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::~QHash
            ((QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *)(this + 0x50));
  QHash<QGesture_*,_QPointer<QWidget>_>::~QHash
            ((QHash<QGesture_*,_QPointer<QWidget>_> *)(this + 0x40));
  QHash<QGesture_*,_QObject_*>::~QHash((QHash<QGesture_*,_QObject_*> *)(this + 0x38));
  QHash<QGesture_*,_QGestureRecognizer_*>::~QHash
            ((QHash<QGesture_*,_QGestureRecognizer_*> *)(this + 0x30));
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QGestureManager::ObjectGesture,_QList<QGesture_*>,_std::less<QGestureManager::ObjectGesture>,_std::allocator<std::pair<const_QGestureManager::ObjectGesture,_QList<QGesture_*>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QGestureManager::ObjectGesture,_QList<QGesture_*>,_std::less<QGestureManager::ObjectGesture>,_std::allocator<std::pair<const_QGestureManager::ObjectGesture,_QList<QGesture_*>_>_>_>_>_>
              *)(this + 0x28));
  QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)(this + 0x20));
  QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)(this + 0x18));
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
              *)(this + 0x10));
  QObject::~QObject((QObject *)this);
  if (*(size_t *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QGestureManager::~QGestureManager()
{
    qDeleteAll(m_recognizers);
    for (auto it = m_obsoleteGestures.cbegin(), end = m_obsoleteGestures.cend(); it != end; ++it) {
        qDeleteAll(it.value());
        delete it.key();
    }
}